

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O2

void __thiscall
GetOpt::GetOpt_pp::_parse
          (GetOpt_pp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *value;
  char cVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  char *pcVar5;
  Result RVar6;
  Token *pTVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  float aFloat;
  int anInt;
  string local_1d8;
  stringstream dummy;
  fmtflags afStack_1a0 [92];
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar13 = (this->_app_name)._M_string_length == 0;
  if (bVar13) {
    std::__cxx11::string::_M_assign((string *)&this->_app_name);
  }
  uVar10 = (ulong)bVar13;
  iVar11 = 0;
  do {
    if ((ulong)((long)pbVar3 - (long)pbVar2 >> 5) <= uVar10) {
      this->_last = OK;
      return;
    }
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    value = pbVar4 + uVar10;
    pcVar5 = pbVar4[uVar10]._M_dataplus._M_p;
    cVar1 = *pcVar5;
    if (cVar1 == '@') {
      if (value->_M_string_length < 2) goto LAB_001097f7;
      std::__cxx11::string::substr((ulong)&dummy,(ulong)value);
      _parse_sub_file(this,(string *)&dummy);
      std::__cxx11::string::~string((string *)&dummy);
    }
    else if ((cVar1 == '-') && (1 < value->_M_string_length)) {
      if (pcVar5[1] == '-') {
        if (value->_M_string_length == 2) {
          pTVar7 = _add_token(this,value,GlobalArgument);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                   ::operator[](&this->_longOps,value);
          pmVar8->token = pTVar7;
        }
        else {
          std::__cxx11::string::substr((ulong)&dummy,(ulong)value);
          pTVar7 = _add_token(this,(string *)&dummy,LongOption);
          std::__cxx11::string::substr((ulong)&local_1d8,(ulong)value);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                   ::operator[](&this->_longOps,&local_1d8);
          pmVar8->token = pTVar7;
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&dummy);
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&dummy);
        RVar6 = convert<int>(value,&anInt,
                             *(fmtflags *)((long)afStack_1a0 + *(long *)(_dummy + -0x18)));
        if (RVar6 == OK) {
          if (2 < value->_M_string_length) goto LAB_0010992c;
          pTVar7 = _add_token(this,value,PossibleNegativeArgument);
          pmVar9 = std::
                   map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                   ::operator[](&this->_shortOps,(value->_M_dataplus)._M_p + 1);
          pmVar9->token = pTVar7;
        }
        else {
          RVar6 = convert<float>(value,&aFloat,
                                 *(fmtflags *)((long)afStack_1a0 + *(long *)(_dummy + -0x18)));
          if (RVar6 == OK) {
LAB_0010992c:
            _add_token(this,value,iVar11 * 4 + GlobalArgument);
          }
          else {
            for (uVar12 = 1; uVar12 < value->_M_string_length; uVar12 = uVar12 + 1) {
              std::__cxx11::string::string((string *)&local_1d8,(string *)value,uVar12,1);
              pTVar7 = _add_token(this,&local_1d8,ShortOption);
              pmVar9 = std::
                       map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                       ::operator[](&this->_shortOps,(value->_M_dataplus)._M_p + uVar12);
              pmVar9->token = pTVar7;
              std::__cxx11::string::~string((string *)&local_1d8);
            }
          }
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&dummy);
      }
      iVar11 = 1;
    }
    else {
LAB_001097f7:
      _add_token(this,value,iVar11 * 4 + GlobalArgument);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

GETOPT_INLINE void GetOpt_pp::_parse(const std::vector<std::string>& args)
{
    bool any_option_processed = false;
    const size_t argc = args.size();

    size_t start = 0;
    if ( _app_name.empty() )
    {
        _app_name = args[0];
        start = 1;
    }

    // parse arguments by their '-' or '--':
    //   (this will be a state machine soon)
    for (size_t i = start; i < argc; i++)
    {
        const std::string& currentArg = args[i];

        if (currentArg[0] == '-' && currentArg.size() > 1)
        {
            // see what's next, differentiate whether it's short or long:
            if (currentArg[1] == '-')
            {
                if ( currentArg.size() > 2 )
                {
                    // long option
                    _longOps[currentArg.substr(2)].token = _add_token(currentArg.substr(2), Token::LongOption);
                }
                else
                {
                    // it's the -- option alone
                    _longOps[currentArg].token = _add_token(currentArg, Token::GlobalArgument);
                }

                any_option_processed = true;
            }
            else
            {
                // check if it is a negative number: rules
                //  * floating point negative numbers are straight classified as 'arguments'
                //  * integer negative numbers of more than 1 digit length are also 'arguments'
                //  * integer negatives of 1 digit length can be either arguments or short options.
                //  * anything else: short options.
                int anInt;
                float aFloat;
                std::stringstream dummy;
                if ( convert(currentArg, anInt, dummy.flags()) == _Option::OK )
                {
                    if ( currentArg.size() > 2 ) // if it's larger than -d (d=digit), then assume it's a negative number:
                        _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
                    else // size == 2: it's a 1 digit negative number
                        _shortOps[currentArg[1]].token = _add_token(currentArg, Token::PossibleNegativeArgument);
                }
                else if ( convert(currentArg, aFloat, dummy.flags()) == _Option::OK )
                    _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
                else
                {
                    // short option
                    // iterate over all of them, keeping the last one in currentData
                    // (so the intermediates will generate 'existent' arguments, as of '-abc')
                    for( size_t j = 1; j < currentArg.size(); j++ )
                        _shortOps[currentArg[j]].token = _add_token(std::string(currentArg, j, 1), Token::ShortOption);
                }

                any_option_processed = true;
            }
        }
        else if ( currentArg[0] == '@' && currentArg.size() > 1 )
        {
            // suboptions file
            _parse_sub_file(currentArg.substr(1));
        }
        else
        {
            _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
        }
    }

    _last = _Option::OK;    // TODO: IMPROVE!!
}